

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

Poll * __thiscall Poll::subscribe(Poll *this,shared_ptr<Subscriber> *sub)

{
  int iVar1;
  mapped_type *pmVar2;
  int local_24;
  pollfd local_20;
  
  iVar1 = Subscriber::get_fd((sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  if (-1 < iVar1) {
    iVar1 = Subscriber::get_fd((sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
    iVar1 = ioctl(iVar1,0x5421,&YES);
    no_err(iVar1,"Setting to non blocking");
  }
  local_20.fd = Subscriber::get_fd((sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_ptr);
  local_20.events =
       Subscriber::get_mask
                 ((sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_20.revents = 0;
  std::vector<pollfd,_std::allocator<pollfd>_>::emplace_back<pollfd>(&this->fds,&local_20);
  local_24 = Subscriber::get_fd((sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->subs,&local_24);
  (pmVar2->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar2->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             &(sub->super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return this;
}

Assistant:

Poll &Poll::subscribe(std::shared_ptr<Subscriber> sub) {
  if (sub->get_fd() >= 0)
    no_err(ioctl(sub->get_fd(), FIONBIO, (char *) &YES), "Setting to non blocking");
  fds.push_back({.fd = sub->get_fd(), .events = sub->get_mask(), .revents = 0});
  subs[sub->get_fd()] = sub;
  return *this;
}